

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O0

void __thiscall
bssl::HPKETest_X25519EncapSmallOrderPoint_Test::TestBody
          (HPKETest_X25519EncapSmallOrderPoint_Test *this)

{
  _func_EVP_HPKE_AEAD_ptr *p_Var1;
  bool bVar2;
  int iVar3;
  evp_hpke_key_st *peVar4;
  EVP_HPKE_KEM *pEVar5;
  char *pcVar6;
  EVP_HPKE_KDF *pEVar7;
  EVP_HPKE_AEAD *pEVar8;
  evp_hpke_ctx_st *peVar9;
  char *in_R9;
  string local_850;
  AssertHelper local_830;
  Message local_828;
  bool local_819;
  undefined1 local_818 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_7e8;
  Message local_7e0;
  bool local_7d1;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_7a0;
  Message local_798;
  bool local_789;
  undefined1 local_788 [8];
  AssertionResult gtest_ar__3;
  ScopedEVP_HPKE_CTX recipient_ctx;
  AssertHelper local_490;
  Message local_488;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_448;
  Message local_440;
  bool local_431;
  undefined1 local_430 [8];
  AssertionResult gtest_ar__1;
  size_t enc_len;
  uint8_t enc [32];
  ScopedEVP_HPKE_CTX sender_ctx;
  ScopedTrace gtest_trace_489;
  _func_EVP_HPKE_AEAD_ptr *aead;
  _func_EVP_HPKE_AEAD_ptr **__end2;
  _func_EVP_HPKE_AEAD_ptr **__begin2;
  _func_EVP_HPKE_AEAD_ptr *(*__range2) [3];
  _func_EVP_HPKE_KDF_ptr *p_Stack_100;
  ScopedTrace gtest_trace_487;
  _func_EVP_HPKE_KDF_ptr *kdf;
  _func_EVP_HPKE_KDF_ptr **__end1;
  _func_EVP_HPKE_KDF_ptr **__begin1;
  _func_EVP_HPKE_KDF_ptr *(*__range1) [1];
  string local_d8;
  AssertHelper local_b8;
  Message local_b0 [3];
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  ScopedEVP_HPKE_KEY key;
  HPKETest_X25519EncapSmallOrderPoint_Test *this_local;
  
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  peVar4 = internal::
           StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
           ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&gtest_ar_.message_);
  pEVar5 = EVP_hpke_x25519_hkdf_sha256();
  local_94 = EVP_HPKE_KEY_generate(peVar4,pEVar5);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_90,&local_94,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar2) {
    testing::Message::Message(local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_90,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x1e4,pcVar6);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (bVar2) {
    for (__end1 = (_func_EVP_HPKE_KDF_ptr **)&(anonymous_namespace)::kAllKDFs;
        __end1 != (_func_EVP_HPKE_KDF_ptr **)&DAT_00aa6ae8; __end1 = __end1 + 1) {
      p_Stack_100 = *__end1;
      pEVar7 = (*p_Stack_100)();
      __range2._4_2_ = EVP_HPKE_KDF_id(pEVar7);
      testing::ScopedTrace::ScopedTrace<unsigned_short>
                ((ScopedTrace *)((long)&__range2 + 7),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x1e7,(unsigned_short *)((long)&__range2 + 4));
      for (__end2 = (_func_EVP_HPKE_AEAD_ptr **)&(anonymous_namespace)::kAllAEADs;
          __end2 != (_func_EVP_HPKE_AEAD_ptr **)&HPKETest_VerifyTestVectors_Test::vtable;
          __end2 = __end2 + 1) {
        p_Var1 = *__end2;
        pEVar8 = (*p_Var1)();
        sender_ctx.ctx_._708_2_ = EVP_HPKE_AEAD_id(pEVar8);
        testing::ScopedTrace::ScopedTrace<unsigned_short>
                  ((ScopedTrace *)&sender_ctx.ctx_.field_0x2c7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                   ,0x1e9,(unsigned_short *)&sender_ctx.ctx_.field_0x2c4);
        internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
        StackAllocated((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                        *)(enc + 0x18));
        peVar9 = internal::
                 StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
                 get((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                      *)(enc + 0x18));
        pEVar5 = EVP_hpke_x25519_hkdf_sha256();
        pEVar7 = (*p_Stack_100)();
        pEVar8 = (*p_Var1)();
        iVar3 = EVP_HPKE_CTX_setup_sender
                          (peVar9,(uint8_t *)&enc_len,(size_t *)&gtest_ar__1.message_,0x20,pEVar5,
                           pEVar7,pEVar8,TestBody::kSmallOrderPoint,0x20,(uint8_t *)0x0,0);
        local_431 = iVar3 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_430,&local_431,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
        if (!bVar2) {
          testing::Message::Message(&local_440);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__2.message_,(internal *)local_430,
                     (AssertionResult *)
                     "EVP_HPKE_CTX_setup_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), EVP_hpke_x25519_hkdf_sha256(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0)"
                     ,"true","false",(char *)pEVar7);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_448,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                     ,0x1f1,pcVar6);
          testing::internal::AssertHelper::operator=(&local_448,&local_440);
          testing::internal::AssertHelper::~AssertHelper(&local_448);
          std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_440);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
        peVar9 = internal::
                 StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
                 get((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                      *)(enc + 0x18));
        peVar4 = internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&gtest_ar_.message_);
        pEVar7 = (*p_Stack_100)();
        pEVar8 = (*p_Var1)();
        iVar3 = EVP_HPKE_CTX_setup_auth_sender
                          (peVar9,(uint8_t *)&enc_len,(size_t *)&gtest_ar__1.message_,0x20,peVar4,
                           pEVar7,pEVar8,TestBody::kSmallOrderPoint,0x20,(uint8_t *)0x0,0);
        local_479 = iVar3 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_478,&local_479,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
        if (!bVar2) {
          testing::Message::Message(&local_488);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&recipient_ctx.ctx_.is_sender,(internal *)local_478,
                     (AssertionResult *)
                     "EVP_HPKE_CTX_setup_auth_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), key.get(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0)"
                     ,"true","false",(char *)pEVar7);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_490,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                     ,0x1f6,pcVar6);
          testing::internal::AssertHelper::operator=(&local_490,&local_488);
          testing::internal::AssertHelper::~AssertHelper(&local_490);
          std::__cxx11::string::~string((string *)&recipient_ctx.ctx_.is_sender);
          testing::Message::~Message(&local_488);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
        internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
        StackAllocated((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                        *)&gtest_ar__3.message_);
        peVar9 = internal::
                 StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
                 get((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                      *)&gtest_ar__3.message_);
        peVar4 = internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&gtest_ar_.message_);
        pEVar7 = (*p_Stack_100)();
        pEVar8 = (*p_Var1)();
        pcVar6 = (char *)0x20;
        iVar3 = EVP_HPKE_CTX_setup_recipient
                          (peVar9,peVar4,pEVar7,pEVar8,TestBody::kSmallOrderPoint,0x20,
                           (uint8_t *)0x0,0);
        local_789 = iVar3 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_788,&local_789,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
        if (!bVar2) {
          testing::Message::Message(&local_798);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_788,
                     (AssertionResult *)
                     "EVP_HPKE_CTX_setup_recipient( recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0)"
                     ,"true","false",pcVar6);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_7a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                     ,0x1fc,pcVar6);
          testing::internal::AssertHelper::operator=(&local_7a0,&local_798);
          testing::internal::AssertHelper::~AssertHelper(&local_7a0);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_798);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
        peVar9 = internal::
                 StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
                 get((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                      *)&gtest_ar__3.message_);
        peVar4 = internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&gtest_ar_.message_);
        pEVar7 = (*p_Stack_100)();
        pEVar8 = (*p_Var1)();
        pcVar6 = (char *)0x20;
        iVar3 = EVP_HPKE_CTX_setup_auth_recipient
                          (peVar9,peVar4,pEVar7,pEVar8,TestBody::kSmallOrderPoint,0x20,
                           (uint8_t *)0x0,0,TestBody::kValidPoint,0x20);
        local_7d1 = iVar3 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_7d0,&local_7d1,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
        if (!bVar2) {
          testing::Message::Message(&local_7e0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_7d0,
                     (AssertionResult *)
                     "EVP_HPKE_CTX_setup_auth_recipient( recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0, kValidPoint, sizeof(kValidPoint))"
                     ,"true","false",pcVar6);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_7e8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                     ,0x203,pcVar6);
          testing::internal::AssertHelper::operator=(&local_7e8,&local_7e0);
          testing::internal::AssertHelper::~AssertHelper(&local_7e8);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_7e0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
        peVar9 = internal::
                 StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
                 get((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                      *)&gtest_ar__3.message_);
        peVar4 = internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&gtest_ar_.message_);
        pEVar7 = (*p_Stack_100)();
        pEVar8 = (*p_Var1)();
        pcVar6 = (char *)0x20;
        iVar3 = EVP_HPKE_CTX_setup_auth_recipient
                          (peVar9,peVar4,pEVar7,pEVar8,TestBody::kValidPoint,0x20,(uint8_t *)0x0,0,
                           TestBody::kSmallOrderPoint,0x20);
        local_819 = iVar3 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_818,&local_819,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
        if (!bVar2) {
          testing::Message::Message(&local_828);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_850,(internal *)local_818,
                     (AssertionResult *)
                     "EVP_HPKE_CTX_setup_auth_recipient( recipient_ctx.get(), key.get(), kdf(), aead(), kValidPoint, sizeof(kValidPoint), nullptr, 0, kSmallOrderPoint, sizeof(kSmallOrderPoint))"
                     ,"true","false",pcVar6);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_830,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                     ,0x207,pcVar6);
          testing::internal::AssertHelper::operator=(&local_830,&local_828);
          testing::internal::AssertHelper::~AssertHelper(&local_830);
          std::__cxx11::string::~string((string *)&local_850);
          testing::Message::~Message(&local_828);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
        internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
        ~StackAllocated((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                         *)&gtest_ar__3.message_);
        internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
        ~StackAllocated((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                         *)(enc + 0x18));
        testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&sender_ctx.ctx_.field_0x2c7);
      }
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&__range2 + 7));
    }
  }
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(HPKETest, X25519EncapSmallOrderPoint) {
  // Borrowed from X25519Test.SmallOrder.
  static const uint8_t kSmallOrderPoint[32] = {
      0xe0, 0xeb, 0x7a, 0x7c, 0x3b, 0x41, 0xb8, 0xae, 0x16, 0x56, 0xe3,
      0xfa, 0xf1, 0x9f, 0xc4, 0x6a, 0xda, 0x09, 0x8d, 0xeb, 0x9c, 0x32,
      0xb1, 0xfd, 0x86, 0x62, 0x05, 0x16, 0x5f, 0x49, 0xb8,
  };
  static const uint8_t kValidPoint[32] = {
      0xe6, 0xdb, 0x68, 0x67, 0x58, 0x30, 0x30, 0xdb, 0x35, 0x94, 0xc1,
      0xa4, 0x24, 0xb1, 0x5f, 0x7c, 0x72, 0x66, 0x24, 0xec, 0x26, 0xb3,
      0x35, 0x3b, 0x10, 0xa9, 0x03, 0xa6, 0xd0, 0xab, 0x1c, 0x4c,
  };

  ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  for (const auto kdf : kAllKDFs) {
    SCOPED_TRACE(EVP_HPKE_KDF_id(kdf()));
    for (const auto aead : kAllAEADs) {
      SCOPED_TRACE(EVP_HPKE_AEAD_id(aead()));
      // Set up the sender, passing in kSmallOrderPoint as |peer_public_key|.
      ScopedEVP_HPKE_CTX sender_ctx;
      uint8_t enc[X25519_PUBLIC_VALUE_LEN];
      size_t enc_len;
      EXPECT_FALSE(EVP_HPKE_CTX_setup_sender(
          sender_ctx.get(), enc, &enc_len, sizeof(enc),
          EVP_hpke_x25519_hkdf_sha256(), kdf(), aead(), kSmallOrderPoint,
          sizeof(kSmallOrderPoint), nullptr, 0));

      // Likewise with auth.
      EXPECT_FALSE(EVP_HPKE_CTX_setup_auth_sender(
          sender_ctx.get(), enc, &enc_len, sizeof(enc), key.get(), kdf(),
          aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0));

      // Set up the recipient, passing in kSmallOrderPoint as |enc|.
      ScopedEVP_HPKE_CTX recipient_ctx;
      EXPECT_FALSE(EVP_HPKE_CTX_setup_recipient(
          recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint,
          sizeof(kSmallOrderPoint), nullptr, 0));

      // Likewise with auth. With auth, a small-order point could appear as
      // either |enc| or the peer public key.
      EXPECT_FALSE(EVP_HPKE_CTX_setup_auth_recipient(
          recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint,
          sizeof(kSmallOrderPoint), nullptr, 0, kValidPoint,
          sizeof(kValidPoint)));
      EXPECT_FALSE(EVP_HPKE_CTX_setup_auth_recipient(
          recipient_ctx.get(), key.get(), kdf(), aead(), kValidPoint,
          sizeof(kValidPoint), nullptr, 0, kSmallOrderPoint,
          sizeof(kSmallOrderPoint)));
    }
  }
}